

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Syndicated_C2_Req.cpp
# Opt level: O1

bool __thiscall
SRUP_MSG_SYNDICATED_C2_REQ::DeSerialize(SRUP_MSG_SYNDICATED_C2_REQ *this,uint8_t *serial_data)

{
  uint64_t uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint64_t *puVar4;
  uint8_t *puVar5;
  ulong uVar6;
  long lVar7;
  uint8_t bytes [2];
  undefined2 local_2a;
  
  *(this->super_SRUP_MSG).m_version = *serial_data;
  *(this->super_SRUP_MSG).m_msgtype = serial_data[1];
  uVar1 = *(uint64_t *)(serial_data + 2);
  puVar4 = (this->super_SRUP_MSG).m_sequence_ID;
  if (puVar4 != (uint64_t *)0x0) {
    operator_delete(puVar4);
  }
  puVar4 = (uint64_t *)operator_new(8);
  (this->super_SRUP_MSG).m_sequence_ID = puVar4;
  *puVar4 = uVar1;
  uVar1 = *(uint64_t *)(serial_data + 10);
  puVar4 = (this->super_SRUP_MSG).m_sender_ID;
  if (puVar4 != (uint64_t *)0x0) {
    operator_delete(puVar4);
  }
  puVar4 = (uint64_t *)operator_new(8);
  (this->super_SRUP_MSG).m_sender_ID = puVar4;
  *puVar4 = uVar1;
  local_2a = *(undefined2 *)(serial_data + 0x12);
  uVar2 = SRUP_MSG::decodeLength((uint8_t *)&local_2a);
  puVar5 = (this->super_SRUP_MSG).m_token;
  if (puVar5 != (uint8_t *)0x0) {
    operator_delete__(puVar5);
  }
  puVar5 = (uint8_t *)operator_new__((ulong)(uVar2 + 1));
  (this->super_SRUP_MSG).m_token = puVar5;
  memcpy(puVar5,serial_data + 0x14,(ulong)uVar2);
  (this->super_SRUP_MSG).m_token_len = uVar2;
  local_2a = *(undefined2 *)(serial_data + (ulong)uVar2 + 0x14);
  uVar3 = SRUP_MSG::decodeLength((uint8_t *)&local_2a);
  (this->super_SRUP_MSG).m_sig_len = uVar3;
  puVar5 = (this->super_SRUP_MSG).m_signature;
  if (puVar5 != (uint8_t *)0x0) {
    operator_delete__(puVar5);
  }
  uVar6 = (ulong)uVar3;
  puVar5 = (uint8_t *)operator_new__(uVar6);
  (this->super_SRUP_MSG).m_signature = puVar5;
  memcpy(puVar5,serial_data + (uVar2 + 0x16),uVar6);
  lVar7 = (uVar2 + 0x16) + uVar6;
  local_2a = *(undefined2 *)(serial_data + lVar7);
  uVar2 = SRUP_MSG::decodeLength((uint8_t *)&local_2a);
  if (this->m_data != (uint8_t *)0x0) {
    operator_delete__(this->m_data);
  }
  puVar5 = (uint8_t *)operator_new__((ulong)(uVar2 + 1));
  this->m_data = puVar5;
  uVar6 = (ulong)((int)lVar7 + 2);
  memcpy(puVar5,serial_data + uVar6,(ulong)uVar2);
  this->m_data_len = uVar2;
  if (this->m_req_id != (uint8_t *)0x0) {
    operator_delete__(this->m_req_id);
  }
  puVar5 = (uint8_t *)operator_new__(1);
  this->m_req_id = puVar5;
  *puVar5 = serial_data[uVar2 + uVar6];
  return true;
}

Assistant:

bool SRUP_MSG_SYNDICATED_C2_REQ::DeSerialize (const uint8_t *serial_data)
{
    uint16_t x;
    uint32_t p=0;
    uint8_t bytes[2];

    // We need to unmarshall the data to reconstruct the object...
    // We can start with the two bytes for the header.
    // One for the version - and one for the message type.

    std::memcpy(m_version, (uint8_t*) serial_data, 1);
    p+=1;
    std::memcpy(m_msgtype, (uint8_t*) serial_data + p, 1);
    p+=1;

    // Now we have to unmarshall the sequence ID...
    uint8_t sid_bytes[8];
    for (int i=0;i<8;i++)
    {
        std::memcpy(&sid_bytes[i], (uint8_t*) serial_data + p, 1);
        ++p;
    }

    // ... then we copy them into m_sequence_ID
    if (m_sequence_ID != nullptr)
        delete(m_sequence_ID);
    m_sequence_ID = new uint64_t;
    std::memcpy(m_sequence_ID, sid_bytes, 8);

    // Next we have to unmarshall the sender ID...
    uint8_t snd_bytes[8];
    for (int i=0;i<8;i++)
    {
        std::memcpy(&snd_bytes[i], (uint8_t*) serial_data + p, 1);
        ++p;
    }

    // ... then we copy them into the sender ID
    if (m_sender_ID != nullptr)
        delete(m_sender_ID);
    m_sender_ID = new uint64_t;
    std::memcpy(m_sender_ID, snd_bytes, 8);

    // Now we have two-bytes for the size of the token ... and x bytes for the token
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;
    if(m_token != nullptr)
        delete[] m_token;
    m_token = new uint8_t[x+1];
    std::memcpy(m_token, (uint8_t *) serial_data + p, x);
    m_token_len = x;
    p+=x;

    // The next two bytes are the size of the signature...
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;

    m_sig_len = x;

    // The next x bytes are the value of the signature.
    if(m_signature != nullptr)
        delete[] m_signature;
    m_signature = new unsigned char[x];
    std::memcpy(m_signature, serial_data + p, x);

    p+=x;

    // ...and now the data
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;
    if(m_data != nullptr)
        delete[] m_data;
    m_data = new uint8_t[x+1];
    std::memcpy(m_data, (uint8_t *) serial_data + p, x);
    m_data_len = x;

    p+=x;
    // Lastly we have one byte for the request ID.

    delete[] m_req_id;
    m_req_id = new uint8_t[1];
    std::memcpy(m_req_id, serial_data + p, 1);

    return true;
}